

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

int ucstricmp(qsizetype alen,char16_t *a,qsizetype blen,char *b)

{
  char16_t cVar1;
  char16_t cVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = blen;
  if (alen < blen) {
    lVar4 = alen;
  }
  lVar3 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar3;
  }
  do {
    if (lVar4 == lVar3) {
      if (lVar4 == alen) {
        return -(uint)(alen != blen);
      }
      return 1;
    }
    cVar1 = foldCase(a[lVar3]);
    cVar2 = foldCase((ushort)(byte)b[lVar3]);
    lVar3 = lVar3 + 1;
  } while ((uint)(ushort)cVar1 - (uint)(ushort)cVar2 == 0);
  return (uint)(ushort)cVar1 - (uint)(ushort)cVar2;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp(qsizetype alen, const char16_t *a, qsizetype blen, const char *b)
{
    qsizetype l = qMin(alen, blen);
    qsizetype i;
    for (i = 0; i < l; ++i) {
        int diff = foldCase(a[i]) - foldCase(char16_t{uchar(b[i])});
        if ((diff))
            return diff;
    }
    if (i == alen) {
        if (i == blen)
            return 0;
        return -1;
    }
    return 1;
}